

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall cmLocalGenerator::AddUnityBuild(cmLocalGenerator *this,cmGeneratorTarget *target)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  iterator __position;
  pointer ppcVar3;
  undefined8 uVar4;
  cmGeneratorTarget *this_00;
  bool bVar5;
  int iVar6;
  _Base_ptr p_Var7;
  _Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_unsigned_long>_> _Var8;
  string *psVar9;
  cmValue cVar10;
  cmListFileBacktrace *backtrace;
  cmValue cVar11;
  undefined8 *puVar12;
  cmSourceFile *pcVar13;
  long lVar14;
  long *plVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  pointer *pppcVar17;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range2;
  _Base_ptr p_Var18;
  UnitySource *file;
  value_type *__x;
  undefined8 value;
  pointer ppcVar19;
  value_type *pvVar20;
  pair<std::_Rb_tree_iterator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>,_bool> pVar21;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  value_type entry;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  cmLocalGenerator *local_1f8;
  string local_1f0;
  cmGeneratorTarget *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  cmSourceFile *sf;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  string local_188;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  unitySources;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  size_t local_128;
  cmValue local_120;
  cmValue local_118;
  value_type *local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  size_type local_f0;
  string lang;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  filtered_sources;
  string filename_base;
  pointer local_70;
  char *local_68;
  map<const_cmSourceFile_*,_unsigned_long,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
  index;
  
  pppcVar17 = &sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppcVar17;
  local_1f8 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sources,"UNITY_BUILD","");
  bVar5 = cmGeneratorTarget::GetPropertyAsBool(target,(string *)&sources);
  if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppcVar17) {
    operator_delete(sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  if (bVar5) {
    unitySources.
    super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unitySources.
    super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    unitySources.
    super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1d0 = target;
    cmMakefile::GetGeneratorConfigs_abi_cxx11_(&configs,local_1f8->Makefile,IncludeEmptyConfig);
    p_Var1 = &index._M_t._M_impl.super__Rb_tree_header;
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1f0._M_dataplus._M_p = (pointer)0x0;
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    index._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    if (configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        configs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmGeneratorTarget::GetSourceFiles
                  (local_1d0,&sources,
                   configs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (long)local_1f0._M_dataplus._M_p);
        ppcVar3 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppcVar19 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                        _M_impl.super__Vector_impl_data._M_start; ppcVar19 != ppcVar3;
            ppcVar19 = ppcVar19 + 1) {
          sf = *ppcVar19;
          _Var8._M_node = &p_Var1->_M_header;
          p_Var2 = index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_002106f4:
            std::
            vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>
            ::emplace_back<cmSourceFile*&>
                      ((vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>
                        *)&unitySources,&sf);
            entry.second = ((long)unitySources.
                                  super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)unitySources.
                                  super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
            entry.first = sf;
            pVar21 = std::
                     _Rb_tree<cmSourceFile_const*,std::pair<cmSourceFile_const*const,unsigned_long>,std::_Select1st<std::pair<cmSourceFile_const*const,unsigned_long>>,std::less<cmSourceFile_const*>,std::allocator<std::pair<cmSourceFile_const*const,unsigned_long>>>
                     ::_M_emplace_unique<std::pair<cmSourceFile_const*const,unsigned_long>&>
                               ((_Rb_tree<cmSourceFile_const*,std::pair<cmSourceFile_const*const,unsigned_long>,std::_Select1st<std::pair<cmSourceFile_const*const,unsigned_long>>,std::less<cmSourceFile_const*>,std::allocator<std::pair<cmSourceFile_const*const,unsigned_long>>>
                                 *)&index,&entry);
            _Var8 = pVar21.first._M_node;
          }
          else {
            do {
              p_Var18 = p_Var2;
              p_Var7 = _Var8._M_node;
              pcVar13 = *(cmSourceFile **)(p_Var18 + 1);
              _Var8._M_node = p_Var18;
              if (pcVar13 < sf) {
                _Var8._M_node = p_Var7;
              }
              p_Var2 = (&p_Var18->_M_left)[pcVar13 < sf];
            } while ((&p_Var18->_M_left)[pcVar13 < sf] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)_Var8._M_node == p_Var1) goto LAB_002106f4;
            if (pcVar13 < sf) {
              p_Var18 = p_Var7;
            }
            if (sf < *(cmSourceFile **)(p_Var18 + 1)) goto LAB_002106f4;
          }
          p_Var2 = _Var8._M_node[1]._M_parent;
          __position._M_current =
               unitySources.
               super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)p_Var2].Configs.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              unitySources.
              super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)p_Var2].Configs.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                       &unitySources.
                        super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)p_Var2].Configs,__position,
                       (unsigned_long *)&local_1f0);
          }
          else {
            *__position._M_current = (unsigned_long)local_1f0._M_dataplus._M_p;
            unitySources.
            super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)p_Var2].Configs.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_1f0._M_dataplus._M_p = local_1f0._M_dataplus._M_p + 1;
      } while (local_1f0._M_dataplus._M_p <
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)configs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)configs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    cmStateSnapshot::GetDirectory
              ((cmStateDirectory *)&sources,&(local_1f8->super_cmOutputConverter).StateSnapshot);
    psVar9 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&sources);
    this_00 = local_1d0;
    ppcVar19 = (pointer)(psVar9->_M_dataplus)._M_p;
    ppcVar3 = (pointer)psVar9->_M_string_length;
    cmGeneratorTarget::GetName_abi_cxx11_(local_1d0);
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0xc;
    views._M_len = 4;
    views._M_array = (iterator)&sources;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = ppcVar3;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar19;
    cmCatViews_abi_cxx11_(&filename_base,views);
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppcVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sources,"UNITY_BUILD_BATCH_SIZE","");
    cVar10 = cmGeneratorTarget::GetProperty(this_00,(string *)&sources);
    if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)pppcVar17) {
      operator_delete(sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)sources.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    if (cVar10.Value == (string *)0x0) {
      local_128 = 0;
    }
    else {
      iVar6 = atoi(((cVar10.Value)->_M_dataplus)._M_p);
      local_128 = (size_t)iVar6;
    }
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppcVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&sources,"UNITY_BUILD_CODE_BEFORE_INCLUDE","");
    local_118 = cmGeneratorTarget::GetProperty(this_00,(string *)&sources);
    if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)pppcVar17) {
      operator_delete(sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)sources.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppcVar17;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&sources,"UNITY_BUILD_CODE_AFTER_INCLUDE","");
    local_120 = cmGeneratorTarget::GetProperty(this_00,(string *)&sources);
    if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)pppcVar17) {
      operator_delete(sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)sources.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppcVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&sources,"UNITY_BUILD_MODE","");
    cVar10 = cmGeneratorTarget::GetProperty(this_00,(string *)&sources);
    if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)pppcVar17) {
      operator_delete(sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)sources.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
    local_70 = (pointer)0x6ed18d;
    local_68 = "CXX";
    backtrace = &local_1f8->DirectoryBacktrace;
    lVar14 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lang,*(char **)((long)&local_70 + lVar14),(allocator<char> *)&sources);
      filtered_sources.
      super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      filtered_sources.
      super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      filtered_sources.
      super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (unitySources.
          super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          unitySources.
          super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_110 = unitySources.
                    super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        __x = unitySources.
              super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
              ._M_impl.super__Vector_impl_data._M_start;
        pvVar20 = unitySources.
                  super__Vector_base<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        do {
          pcVar13 = __x->Source;
          cmSourceFile::GetLanguage_abi_cxx11_((string *)&sources,pcVar13);
          if ((sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_finish == (pointer)lang._M_string_length) &&
             ((sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_finish == (pointer)0x0 ||
              (iVar6 = bcmp(sources.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,lang._M_dataplus._M_p,
                            (size_t)sources.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish), iVar6 == 0)))) {
            entry.first = (cmSourceFile *)&local_208;
            local_1f0._M_dataplus._M_p = (pointer)0x1a;
            entry.first = (cmSourceFile *)
                          std::__cxx11::string::_M_create((ulong *)&entry,(ulong)&local_1f0);
            local_208._M_allocated_capacity = (size_type)local_1f0._M_dataplus._M_p;
            *(undefined8 *)&((entry.first)->Location).field_0xa = 0x495f444c4955425f;
            builtin_strncpy((char *)((long)&((entry.first)->Location).Directory._M_dataplus._M_p + 2
                                    ),"NCLUSION",8);
            ((entry.first)->Location).Makefile = (cmMakefile *)0x494e555f50494b53;
            ((entry.first)->Location).AmbiguousDirectory = true;
            ((entry.first)->Location).AmbiguousExtension = true;
            ((entry.first)->Location).field_0xa = '_';
            ((entry.first)->Location).field_0xb = 'B';
            ((entry.first)->Location).field_0xc = 'U';
            ((entry.first)->Location).field_0xd = 'I';
            ((entry.first)->Location).field_0xe = 'L';
            ((entry.first)->Location).field_0xf = 'D';
            entry.second = (unsigned_long)local_1f0._M_dataplus._M_p;
            local_1f0._M_dataplus._M_p[(long)&(entry.first)->Location] = '\0';
            bVar5 = cmSourceFile::GetPropertyAsBool(pcVar13,(string *)&entry);
            if (bVar5) {
              bVar5 = false;
            }
            else {
              local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
              sf = (cmSourceFile *)0x10;
              local_1f0._M_dataplus._M_p =
                   (pointer)std::__cxx11::string::_M_create((ulong *)&local_1f0,(ulong)&sf);
              local_1f0.field_2._0_8_ = sf;
              *(undefined8 *)local_1f0._M_dataplus._M_p = 0x465f524544414548;
              builtin_strncpy((char *)((long)local_1f0._M_dataplus._M_p + 8),"ILE_ONLY",8);
              local_1f0._M_string_length = (size_type)sf;
              *(char *)((long)&(sf->Location).Makefile + (long)local_1f0._M_dataplus._M_p) = '\0';
              bVar5 = cmSourceFile::GetPropertyAsBool(pcVar13,&local_1f0);
              if (bVar5) {
                bVar5 = false;
                pvVar20 = local_110;
              }
              else {
                sf = (cmSourceFile *)&local_198;
                local_198._8_7_ = 0x534e4f4954504f;
                local_198._M_allocated_capacity._0_7_ = 0x454c49504d4f43;
                local_198._M_local_buf[7] = '_';
                local_1a0 = 0xf;
                local_198._M_local_buf[0xf] = '\0';
                cVar11 = cmSourceFile::GetProperty(pcVar13,(string *)&sf);
                pvVar20 = local_110;
                if (cVar11.Value == (string *)0x0) {
                  local_1c8._M_allocated_capacity = (size_type)&local_1b8;
                  local_188._M_dataplus._M_p = (pointer)0x13;
                  local_1c8._M_allocated_capacity =
                       std::__cxx11::string::_M_create
                                 (&local_1c8._M_allocated_capacity,(ulong)&local_188);
                  local_1b8._M_allocated_capacity = (size_type)local_188._M_dataplus._M_p;
                  *(undefined8 *)local_1c8._M_allocated_capacity = 0x5f454c49504d4f43;
                  builtin_strncpy((char *)(local_1c8._M_allocated_capacity + 8),"DEFINITI",8);
                  builtin_strncpy((char *)(local_1c8._M_allocated_capacity + 0xf),"IONS",4);
                  local_1c8._8_8_ = local_188._M_dataplus._M_p;
                  local_188._M_dataplus._M_p[local_1c8._M_allocated_capacity] = '\0';
                  cVar11 = cmSourceFile::GetProperty(pcVar13,(string *)&local_1c8);
                  if (cVar11.Value == (string *)0x0) {
                    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
                    local_188.field_2._8_5_ = 0x5347414c46;
                    local_188.field_2._M_allocated_capacity._0_5_ = 0x49504d4f43;
                    local_188.field_2._M_allocated_capacity._5_3_ = 0x5f454c;
                    local_188._M_string_length = 0xd;
                    local_188.field_2._M_local_buf[0xd] = '\0';
                    cVar11 = cmSourceFile::GetProperty(pcVar13,&local_188);
                    if (cVar11.Value == (string *)0x0) {
                      local_148._M_allocated_capacity = (size_type)&local_138;
                      local_f0 = 0x13;
                      local_148._M_allocated_capacity =
                           std::__cxx11::string::_M_create
                                     (&local_148._M_allocated_capacity,(ulong)&local_f0);
                      local_138._M_allocated_capacity = local_f0;
                      *(undefined8 *)local_148._M_allocated_capacity = 0x5f4544554c434e49;
                      *(char *)(local_148._M_allocated_capacity + 8) = 'D';
                      *(char *)(local_148._M_allocated_capacity + 9) = 'I';
                      *(char *)(local_148._M_allocated_capacity + 10) = 'R';
                      *(char *)(local_148._M_allocated_capacity + 0xb) = 'E';
                      *(char *)(local_148._M_allocated_capacity + 0xc) = 'C';
                      *(char *)(local_148._M_allocated_capacity + 0xd) = 'T';
                      *(char *)(local_148._M_allocated_capacity + 0xe) = 'O';
                      *(char *)(local_148._M_allocated_capacity + 0xf) = 'R';
                      *(char *)(local_148._M_allocated_capacity + 0xf) = 'R';
                      *(char *)(local_148._M_allocated_capacity + 0x10) = 'I';
                      *(char *)(local_148._M_allocated_capacity + 0x11) = 'E';
                      *(char *)(local_148._M_allocated_capacity + 0x12) = 'S';
                      local_148._8_8_ = local_f0;
                      *(char *)(local_148._M_allocated_capacity + local_f0) = '\0';
                      cVar11 = cmSourceFile::GetProperty(pcVar13,(string *)&local_148);
                      bVar5 = cVar11.Value == (string *)0x0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_148._M_allocated_capacity != &local_138) {
                        operator_delete((void *)local_148._M_allocated_capacity,
                                        local_138._M_allocated_capacity + 1);
                      }
                    }
                    else {
                      bVar5 = false;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_188._M_dataplus._M_p != &local_188.field_2) {
                      operator_delete(local_188._M_dataplus._M_p,
                                      CONCAT35(local_188.field_2._M_allocated_capacity._5_3_,
                                               local_188.field_2._M_allocated_capacity._0_5_) + 1);
                    }
                  }
                  else {
                    bVar5 = false;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c8._M_allocated_capacity != &local_1b8) {
                    operator_delete((void *)local_1c8._M_allocated_capacity,
                                    (ulong)(local_1b8._M_allocated_capacity + 1));
                  }
                }
                else {
                  bVar5 = false;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)sf != &local_198) {
                  operator_delete(sf,CONCAT17(local_198._M_local_buf[7],
                                              local_198._M_allocated_capacity._0_7_) + 1);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,(ulong)(local_1f0.field_2._0_8_ + 1));
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)entry.first != &local_208) {
              operator_delete(entry.first,(ulong)(local_208._M_allocated_capacity + 1));
            }
          }
          else {
            bVar5 = false;
          }
          if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (pointer)&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(sources.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)sources.
                                  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          if (bVar5) {
            std::
            vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
            ::push_back(&filtered_sources,__x);
          }
          __x = __x + 1;
        } while (__x != pvVar20);
      }
      pppcVar17 = &sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1c8._M_allocated_capacity = 0;
      local_1c8._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_1b8._M_allocated_capacity = 0;
      if ((cVar10.Value == (string *)0x0) ||
         (iVar6 = std::__cxx11::string::compare((char *)cVar10.Value), iVar6 == 0)) {
        AddUnityFilesModeAuto
                  ((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                    *)&entry,local_1f8,local_1d0,&lang,&configs,&filtered_sources,local_118,
                   local_120,&filename_base,local_128);
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_1b8._M_allocated_capacity;
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_1c8._M_allocated_capacity;
        local_1b8._M_allocated_capacity = local_208._M_allocated_capacity;
        local_1c8._M_allocated_capacity = (size_type)entry.first;
        local_1c8._8_8_ = entry.second;
        entry.first = (cmSourceFile *)0x0;
        entry.second = 0;
        local_208._M_allocated_capacity = 0;
        std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
        ~vector((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                 *)&sources);
LAB_00210f92:
        std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
        ~vector((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                 *)&entry);
        value = local_1c8._M_allocated_capacity;
        uVar4 = local_1c8._8_8_;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)cVar10.Value);
        if (iVar6 == 0) {
          AddUnityFilesModeGroup
                    ((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                      *)&entry,local_1f8,local_1d0,&lang,&configs,&filtered_sources,local_118,
                     local_120,&filename_base);
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_1b8._M_allocated_capacity;
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_1c8._8_8_;
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1c8._M_allocated_capacity;
          local_1b8._M_allocated_capacity = local_208._M_allocated_capacity;
          local_1c8._M_allocated_capacity = (size_type)entry.first;
          local_1c8._8_8_ = entry.second;
          entry.first = (cmSourceFile *)0x0;
          entry.second = 0;
          local_208._M_allocated_capacity = 0;
          std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
          ::~vector((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
                     *)&sources);
          goto LAB_00210f92;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sf,
                       "Invalid UNITY_BUILD_MODE value of ",cVar10.Value);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&sf);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 == paVar16) {
          local_1f0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_1f0.field_2._8_8_ = puVar12[3];
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        }
        else {
          local_1f0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_1f0._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_1f0._M_string_length = puVar12[1];
        *puVar12 = paVar16;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(local_1d0);
        plVar15 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_1f0,(ulong)(psVar9->_M_dataplus)._M_p);
        entry.first = (cmSourceFile *)&local_208;
        pcVar13 = (cmSourceFile *)(plVar15 + 2);
        if ((cmSourceFile *)*plVar15 == pcVar13) {
          local_208._M_allocated_capacity = (size_type)(pcVar13->Location).Makefile;
          local_208._8_8_ = plVar15[3];
        }
        else {
          local_208._M_allocated_capacity = (size_type)(pcVar13->Location).Makefile;
          entry.first = (cmSourceFile *)*plVar15;
        }
        entry.second = plVar15[1];
        *plVar15 = (long)pcVar13;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&entry);
        ppcVar19 = (pointer)(plVar15 + 2);
        if ((pointer)*plVar15 == ppcVar19) {
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar19;
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pppcVar17;
        }
        else {
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar19;
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)*plVar15;
        }
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)plVar15[1];
        *plVar15 = (long)ppcVar19;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)entry.first != &local_208) {
          operator_delete(entry.first,(ulong)(local_208._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,(ulong)(local_1f0.field_2._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sf != &local_198) {
          operator_delete(sf,CONCAT17(local_198._M_local_buf[7],
                                      local_198._M_allocated_capacity._0_7_) + 1);
        }
        cmake::IssueMessage(local_1f8->GlobalGenerator->CMakeInstance,FATAL_ERROR,(string *)&sources
                            ,backtrace);
        value = local_1c8._M_allocated_capacity;
        uVar4 = local_1c8._8_8_;
        if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)pppcVar17) {
          operator_delete(sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          value = local_1c8._M_allocated_capacity;
          uVar4 = local_1c8._8_8_;
        }
      }
      for (; value != uVar4; value = &((string *)(value + 0x20))->_M_string_length) {
        pcVar13 = cmMakefile::GetOrCreateSource(local_1f8->Makefile,(string *)value,false,Ambiguous)
        ;
        cmGeneratorTarget::AddSource(local_1d0,(string *)value,true);
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pppcVar17;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sources,"SKIP_UNITY_BUILD_INCLUSION","");
        cmSourceFile::SetProperty(pcVar13,(string *)&sources,"ON");
        if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)pppcVar17) {
          operator_delete(sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pppcVar17;
        std::__cxx11::string::_M_construct<char_const*>((string *)&sources,"UNITY_SOURCE_FILE","");
        cmSourceFile::SetProperty(pcVar13,(string *)&sources,(cmValue)value);
        if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)pppcVar17) {
          operator_delete(sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)sources.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        if (*(char *)&(((string *)(value + 0x20))->_M_dataplus)._M_p == '\x01') {
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pppcVar17;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&sources,"COMPILE_DEFINITIONS","");
          cmSourceFile::SetProperty
                    (pcVar13,(string *)&sources,"CMAKE_UNITY_CONFIG_$<UPPER_CASE:$<CONFIG>>");
          if (sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)pppcVar17) {
            operator_delete(sources.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)sources.
                                  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
        }
      }
      std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
      ~vector((vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
               *)&local_1c8);
      std::
      vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
      ::~vector(&filtered_sources);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)lang._M_dataplus._M_p != &lang.field_2) {
        operator_delete(lang._M_dataplus._M_p,lang.field_2._M_allocated_capacity + 1);
      }
      lVar14 = lVar14 + 8;
    } while (lVar14 != 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filename_base._M_dataplus._M_p != &filename_base.field_2) {
      operator_delete(filename_base._M_dataplus._M_p,filename_base.field_2._M_allocated_capacity + 1
                     );
    }
    std::
    _Rb_tree<const_cmSourceFile_*,_std::pair<const_cmSourceFile_*const,_unsigned_long>,_std::_Select1st<std::pair<const_cmSourceFile_*const,_unsigned_long>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_unsigned_long>_>_>
    ::~_Rb_tree(&index._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configs);
    std::
    vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
    ::~vector(&unitySources);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddUnityBuild(cmGeneratorTarget* target)
{
  if (!target->GetPropertyAsBool("UNITY_BUILD")) {
    return;
  }

  std::vector<UnityBatchedSource> unitySources;

  std::vector<std::string> configs =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  std::map<cmSourceFile const*, size_t> index;

  for (size_t ci = 0; ci < configs.size(); ++ci) {
    // FIXME: Refactor collection of sources to not evaluate object libraries.
    std::vector<cmSourceFile*> sources;
    target->GetSourceFiles(sources, configs[ci]);
    for (cmSourceFile* sf : sources) {
      auto mi = index.find(sf);
      if (mi == index.end()) {
        unitySources.emplace_back(sf);
        std::map<cmSourceFile const*, size_t>::value_type entry(
          sf, unitySources.size() - 1);
        mi = index.insert(entry).first;
      }
      unitySources[mi->second].Configs.emplace_back(ci);
    }
  }

  std::string filename_base =
    cmStrCat(this->GetCurrentBinaryDirectory(), "/CMakeFiles/",
             target->GetName(), ".dir/Unity/");

  cmValue batchSizeString = target->GetProperty("UNITY_BUILD_BATCH_SIZE");
  const size_t unityBatchSize = batchSizeString
    ? static_cast<size_t>(std::atoi(batchSizeString->c_str()))
    : 0;

  cmValue beforeInclude =
    target->GetProperty("UNITY_BUILD_CODE_BEFORE_INCLUDE");
  cmValue afterInclude = target->GetProperty("UNITY_BUILD_CODE_AFTER_INCLUDE");
  cmValue unityMode = target->GetProperty("UNITY_BUILD_MODE");

  for (std::string lang : { "C", "CXX" }) {
    std::vector<UnityBatchedSource> filtered_sources;
    std::copy_if(unitySources.begin(), unitySources.end(),
                 std::back_inserter(filtered_sources),
                 [&](UnityBatchedSource const& ubs) -> bool {
                   cmSourceFile* sf = ubs.Source;
                   return sf->GetLanguage() == lang &&
                     !sf->GetPropertyAsBool("SKIP_UNITY_BUILD_INCLUSION") &&
                     !sf->GetPropertyAsBool("HEADER_FILE_ONLY") &&
                     !sf->GetProperty("COMPILE_OPTIONS") &&
                     !sf->GetProperty("COMPILE_DEFINITIONS") &&
                     !sf->GetProperty("COMPILE_FLAGS") &&
                     !sf->GetProperty("INCLUDE_DIRECTORIES");
                 });

    std::vector<UnitySource> unity_files;
    if (!unityMode || *unityMode == "BATCH") {
      unity_files = AddUnityFilesModeAuto(
        target, lang, configs, filtered_sources, beforeInclude, afterInclude,
        filename_base, unityBatchSize);
    } else if (unityMode && *unityMode == "GROUP") {
      unity_files =
        AddUnityFilesModeGroup(target, lang, configs, filtered_sources,
                               beforeInclude, afterInclude, filename_base);
    } else {
      // unity mode is set to an unsupported value
      std::string e("Invalid UNITY_BUILD_MODE value of " + *unityMode +
                    " assigned to target " + target->GetName() +
                    ". Acceptable values are BATCH and GROUP.");
      this->IssueMessage(MessageType::FATAL_ERROR, e);
    }

    for (UnitySource const& file : unity_files) {
      auto* unity = this->GetMakefile()->GetOrCreateSource(file.Path);
      target->AddSource(file.Path, true);
      unity->SetProperty("SKIP_UNITY_BUILD_INCLUSION", "ON");
      unity->SetProperty("UNITY_SOURCE_FILE", file.Path);
      if (file.PerConfig) {
        unity->SetProperty("COMPILE_DEFINITIONS",
                           "CMAKE_UNITY_CONFIG_$<UPPER_CASE:$<CONFIG>>");
      }
    }
  }
}